

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcDuctFittingType::IfcDuctFittingType(IfcDuctFittingType *this)

{
  IfcDuctFittingType *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x1e0,"IfcDuctFittingType");
  Schema_2x3::IfcFlowFittingType::IfcFlowFittingType
            (&this->super_IfcFlowFittingType,&PTR_construction_vtable_24__00e42ff0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcDuctFittingType,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcDuctFittingType,_1UL> *)
             &(this->super_IfcFlowFittingType).super_IfcDistributionFlowElementType.field_0x1b0,
             &PTR_construction_vtable_24__00e431d0);
  *(undefined8 *)
   &(this->super_IfcFlowFittingType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject =
       0xe42e70;
  *(undefined8 *)&this->field_0x1e0 = 0xe42fd8;
  *(undefined8 *)
   &(this->super_IfcFlowFittingType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0x88 = 0xe42e98;
  (this->super_IfcFlowFittingType).super_IfcDistributionFlowElementType.
  super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0xe42ec0;
  *(undefined8 *)
   &(this->super_IfcFlowFittingType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0xf0 = 0xe42ee8;
  *(undefined8 *)
   &(this->super_IfcFlowFittingType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.field_0x148 =
       0xe42f10;
  *(undefined8 *)
   &(this->super_IfcFlowFittingType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x180 = 0xe42f38;
  *(undefined8 *)
   &(this->super_IfcFlowFittingType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x190 = 0xe42f60;
  *(undefined8 *)
   &(this->super_IfcFlowFittingType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.field_0x1a0 = 0xe42f88;
  *(undefined8 *)&(this->super_IfcFlowFittingType).super_IfcDistributionFlowElementType.field_0x1b0
       = 0xe42fb0;
  std::__cxx11::string::string((string *)&(this->super_IfcFlowFittingType).field_0x1c0);
  return;
}

Assistant:

IfcDuctFittingType() : Object("IfcDuctFittingType") {}